

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O3

void __thiscall
booster::hold_ptr<cppcms::application::_data>::~hold_ptr(hold_ptr<cppcms::application::_data> *this)

{
  _Atomic_word *p_Var1;
  _data *p_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer ppaVar4;
  int iVar5;
  
  p_Var2 = this->ptr_;
  if (p_Var2 != (_data *)0x0) {
    p_Var3 = (p_Var2->my_pool).
             super___weak_ptr<cppcms::application_specific_pool,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var3->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var3->_M_weak_count;
        p_Var3->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var3->_vptr__Sp_counted_base[3])();
      }
    }
    ppaVar4 = (p_Var2->managed_children).
              super__Vector_base<cppcms::application_*,_std::allocator<cppcms::application_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppaVar4 != (pointer)0x0) {
      operator_delete(ppaVar4);
    }
    hold_ptr<cppcms::url_mapper>::~hold_ptr(&p_Var2->url_map);
    hold_ptr<cppcms::url_dispatcher>::~hold_ptr(&p_Var2->url_disp);
    p_Var3 = (p_Var2->conn).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
    }
    operator_delete(p_Var2);
    return;
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}